

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O0

uint32_t __thiscall phosg::StringReader::pget_u24l(StringReader *this,size_t offset)

{
  out_of_range *this_00;
  size_t offset_local;
  StringReader *this_local;
  
  if (this->length < offset + 3) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"end of string");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  return (uint)CONCAT12(this->data[offset + 2],CONCAT11(this->data[offset + 1],this->data[offset]));
}

Assistant:

inline uint32_t pget_u24l(size_t offset) const {
    if (offset + 3 > this->length) {
      throw std::out_of_range("end of string");
    }
    return this->data[offset] | (this->data[offset + 1] << 8) | (this->data[offset + 2] << 16);
  }